

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb.c
# Opt level: O0

int cubeb_set_log_callback(cubeb_log_level log_level,cubeb_log_callback log_callback)

{
  cubeb_log_callback in_RSI;
  cubeb_log_level in_EDI;
  int local_4;
  
  if (in_EDI < (CUBEB_LOG_VERBOSE|CUBEB_LOG_NORMAL)) {
    if ((in_RSI == (cubeb_log_callback)0x0) && (in_EDI != CUBEB_LOG_DISABLED)) {
      local_4 = -3;
    }
    else if ((g_cubeb_log_callback == (cubeb_log_callback)0x0) ||
            (in_RSI == (cubeb_log_callback)0x0)) {
      g_cubeb_log_level = in_EDI;
      g_cubeb_log_callback = in_RSI;
      if (CUBEB_LOG_NORMAL < in_EDI) {
        cubeb_async_log("Starting cubeb log");
      }
      local_4 = 0;
    }
    else {
      local_4 = -4;
    }
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int
cubeb_set_log_callback(cubeb_log_level log_level,
                       cubeb_log_callback log_callback)
{
  if (log_level < CUBEB_LOG_DISABLED || log_level > CUBEB_LOG_VERBOSE) {
    return CUBEB_ERROR_INVALID_FORMAT;
  }

  if (!log_callback && log_level != CUBEB_LOG_DISABLED) {
    return CUBEB_ERROR_INVALID_PARAMETER;
  }

  if (g_cubeb_log_callback && log_callback) {
    return CUBEB_ERROR_NOT_SUPPORTED;
  }

  g_cubeb_log_callback = log_callback;
  g_cubeb_log_level = log_level;

  // Logging a message here allows to initialize the asynchronous logger from a
  // thread that is not the audio rendering thread, and especially to not
  // initialize it the first time we find a verbose log, which is often in the
  // audio rendering callback, that runs from the audio rendering thread, and
  // that is high priority, and that we don't want to block.
  if (log_level >= CUBEB_LOG_VERBOSE) {
    ALOGV("Starting cubeb log");
  }

  return CUBEB_OK;
}